

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

Vector3d * __thiscall
Util::EGM96Grav::GetGravAccel
          (Vector3d *__return_storage_ptr__,EGM96Grav *this,Vector3d *pos,double JD_UTC)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  Vector3d *pVVar3;
  Vector3d *pVVar4;
  uint uVar5;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *matvecptr;
  int l;
  long lVar6;
  ActualDstType actualDst;
  policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  uint uVar7;
  PointerType ptr;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble lVar11;
  longdouble in_ST2;
  longdouble lVar12;
  longdouble in_ST3;
  longdouble in_ST4;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar19;
  undefined8 extraout_XMM0_Qb;
  ulong uVar20;
  undefined1 auVar18 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  initializer_list<int> __l;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  vector<int,_std::allocator<int>_> order;
  Matrix3d R_ecef2eci;
  Vector3d accel;
  Vector3d accel_central;
  Matrix3d Rsp2cart;
  double local_388;
  double local_340;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_328;
  undefined1 local_308 [16];
  double local_2f8;
  ulong uStack_2f0;
  double local_2e8;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c0;
  Vector3d *local_2b8;
  Vector3d *local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  vector<int,_std::allocator<int>_> local_278;
  vector<int,_std::allocator<int>_> local_260;
  double local_248;
  double local_238;
  ulong uStack_230;
  double local_228;
  ulong uStack_220;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  Matrix3d local_1f8;
  double local_1a8;
  undefined1 auStack_1a0 [16];
  Vector3d local_190;
  double local_178;
  ulong uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128 [3];
  undefined4 uStack_110;
  undefined4 uStack_10c;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double *local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double *local_80;
  Matrix3d local_78;
  
  dVar13 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar15 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar16 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  auVar17._0_8_ = dVar16 * dVar16 + dVar15 * dVar15 + dVar13 * dVar13;
  auVar17._8_8_ = 0;
  local_308 = sqrtpd(auVar17,auVar17);
  local_2c0 = pow(local_308._0_8_,3.0);
  local_2f8 = this->mu_;
  uStack_2f0 = 0;
  dVar16 = this->Rearth_;
  dVar13 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar15 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar13 = dVar15 * dVar15 + dVar13 * dVar13;
  if (dVar13 < 0.0) {
    sqrt(dVar13);
  }
  local_328.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x120);
  local_328.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_328.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  lVar6 = 0;
  do {
    *(undefined8 *)
     ((long)((local_328.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar6) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_328.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar6 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_328.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar6 + 0x18) = 0;
    *(undefined8 *)
     ((long)((local_328.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar6 + 0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_328.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar6 + 0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_328.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar6 + 0x38) = 0;
    *(undefined8 *)
     ((long)((local_328.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar6 + 0x40) = 0x3ff0000000000000;
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0x120);
  local_328.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_328.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  matvecptr = &local_328;
  local_2b0 = __return_storage_ptr__;
  ECEF2ECI(&local_1f8,JD_UTC,this->nut80ptr_,this->iau1980ptr_,matvecptr);
  dVar15 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar25 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar14 = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] * dVar15;
  dVar19 = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] * dVar25;
  dVar13 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  dVar24 = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] * dVar13;
  dVar21 = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] * dVar15;
  dVar23 = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] * dVar25;
  dVar22 = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] * dVar13;
  local_2b8 = pos;
  dVar15 = asin((dVar13 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[8] +
                dVar25 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[7] +
                dVar15 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6]) / (double)local_308._0_8_);
  local_248 = atan2(dVar22 + dVar23 + dVar21,dVar24 + dVar19 + dVar14);
  dVar16 = dVar16 / (double)local_308._0_8_;
  dVar25 = 0.0;
  dVar14 = 0.0;
  l = (int)local_128 + 0x10;
  lVar8 = (longdouble)1.79769313486232e+308;
  local_340 = 0.0;
  uVar20 = 0;
  dVar13 = 2.0;
  do {
    dVar19 = dVar13 + 1.0;
    if (0.0 < dVar19) {
      uVar5 = (uint)dVar13;
      local_178 = -dVar13;
      uStack_170 = uVar20 ^ 0x8000000000000000;
      local_388 = 0.0;
      local_238 = dVar13;
      uStack_230 = uVar20;
      local_228 = dVar19;
      uStack_220 = uVar20;
      do {
        local_148 = dVar25;
        dStack_140 = dVar14;
        local_2d8 = pow(dVar16,local_238);
        uVar7 = (uint)local_388;
        local_208 = (this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data
                    [(this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * (long)(int)uVar7 + (long)(int)uVar5];
        uStack_200 = 0;
        local_218 = (this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data
                    [(this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * (long)(int)uVar7 + (long)(int)uVar5];
        uStack_210 = 0;
        uStack_2d0 = extraout_XMM0_Qb;
        local_2e8 = pow(-1.0,local_388);
        local_280 = sin(dVar15);
        lVar9 = (longdouble)local_280;
        lVar11 = in_ST4;
        lVar12 = in_ST4;
        lVar10 = in_ST4;
        powl();
        boost::math::detail::
        legendre_p_imp<long_double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)(ulong)uVar5,(detail *)(ulong)uVar7,l,(int)matvecptr,lVar9,in_ST0,
                   in_R8);
        dVar13 = 0.0;
        lVar9 = in_ST3;
        in_ST0 = in_ST4;
        if (lVar8 < ABS(in_ST1)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::legendre_p<%1%>(int, int, %1%)","numeric overflow");
          dVar13 = (double)in_ST1;
          lVar9 = in_ST3;
          in_ST0 = in_ST4;
          local_288 = dVar13;
        }
        in_ST3 = lVar10;
        local_290 = (double)in_ST1;
        if (ABS(in_ST1) <= lVar8) {
          dVar13 = local_290;
        }
        dVar19 = pow(-1.0,local_388);
        local_298 = sin(dVar15);
        lVar10 = (longdouble)local_298;
        in_ST4 = in_ST3;
        powl();
        boost::math::detail::
        legendre_p_imp<long_double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)(ulong)(uVar5 - 1),(detail *)(ulong)uVar7,l,(int)matvecptr,lVar10,
                   in_ST2,in_R8);
        dVar14 = 0.0;
        in_ST1 = lVar11;
        in_ST2 = lVar12;
        if (lVar8 < ABS(lVar9)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::legendre_p<%1%>(int, int, %1%)","numeric overflow");
          dVar14 = (double)lVar9;
          in_ST1 = lVar11;
          in_ST2 = lVar12;
          local_2a0 = dVar14;
        }
        local_2a8 = (double)lVar9;
        if (ABS(lVar9) <= lVar8) {
          dVar14 = local_2a8;
        }
        local_2e8 = local_2e8 * dVar13;
        dVar13 = local_228 * local_2d8 * local_2e8;
        dVar25 = local_248 * local_388;
        dVar21 = cos(dVar25);
        dVar22 = sin(dVar25);
        local_340 = local_340 + (dVar21 * local_208 + dVar22 * local_218) * dVar13;
        dVar13 = sin(dVar15);
        dVar13 = dVar13 * local_178;
        dVar21 = cos(dVar15);
        dVar22 = local_238 + local_388;
        dVar23 = cos(dVar15);
        dVar13 = (1.0 / dVar21) * dVar13 * local_2e8;
        dVar21 = cos(dVar25);
        dVar24 = sin(dVar25);
        local_168 = local_2d8 * local_388;
        uStack_160 = uStack_2d0;
        local_158 = cos(dVar25);
        dVar25 = sin(dVar25);
        dVar25 = local_148 + (local_158 * local_218 + -local_208 * dVar25) * local_2e8 * local_168;
        dVar14 = dStack_140 +
                 (dVar21 * local_208 + dVar24 * local_218) *
                 (dVar13 + (1.0 / dVar23) * dVar22 * dVar19 * dVar14) * local_2d8;
        local_388 = local_388 + 1.0;
        dVar19 = local_228;
        uVar20 = uStack_220;
      } while (local_388 < local_228);
    }
    dVar13 = dVar19;
  } while (dVar19 < 21.0);
  dVar25 = local_2f8 * dVar25;
  dVar14 = dVar14 * local_2f8;
  dVar16 = (double)local_308._0_8_ * (double)local_308._0_8_;
  local_308._8_8_ = (double)local_308._8_8_ * (double)local_308._8_8_;
  local_308._0_8_ = dVar16;
  auVar18._0_8_ = cos(dVar15);
  local_2f8 = -local_2f8;
  uStack_2f0 = uStack_2f0 ^ 0x8000000000000000;
  local_1a8 = (local_2f8 / (double)local_308._0_8_) * local_340;
  auVar18._8_8_ = local_308._0_8_;
  auVar2._8_8_ = dVar14;
  auVar2._0_8_ = dVar25 / dVar16;
  auStack_1a0 = divpd(auVar2,auVar18);
  local_128[2] = 6.36598737388395e-314;
  uStack_110 = 1;
  __l._M_len = 3;
  __l._M_array = (iterator)(local_128 + 2);
  std::vector<int,_std::allocator<int>_>::vector(&local_260,__l,(allocator_type *)&local_78);
  local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       -local_248;
  local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       dVar15;
  std::vector<int,_std::allocator<int>_>::vector(&local_278,&local_260);
  pVVar4 = local_2b0;
  pVVar3 = local_2b8;
  Angle2RotM(&local_78,&local_190,&local_278);
  if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_128[0] = local_2f8 / local_2c0;
  local_138 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] * local_128[0];
  dStack_130 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[1] * local_128[0];
  local_128[0] = local_128[0] *
                 (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[2];
  local_a0 = &local_98;
  lVar6 = 0x10;
  do {
    dVar16 = *(double *)
              ((long)local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array + lVar6);
    dVar13 = *(double *)((long)&local_88 + lVar6);
    dVar15 = *(double *)
              ((long)local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array + lVar6 + -8);
    *(double *)((long)local_128 + lVar6) =
         dVar15 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[3] +
         dVar13 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0] +
         dVar16 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[6];
    *(double *)((long)local_128 + lVar6 + 8) =
         dVar15 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[4] +
         dVar13 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1] +
         dVar16 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[7];
    *(double *)((long)local_128 + lVar6 + 0x10) =
         dVar15 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[5] +
         dVar16 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8] +
         dVar13 * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[2];
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x58);
  local_98 = (double)auStack_1a0._0_8_ * local_100 + local_1a8 * local_128[2] +
             (double)auStack_1a0._8_8_ * local_e8;
  dStack_90 = (double)auStack_1a0._0_8_ * dStack_f8 +
              local_1a8 * (double)CONCAT44(uStack_10c,uStack_110) +
              (double)auStack_1a0._8_8_ * dStack_e0;
  local_88 = local_f0 * (double)auStack_1a0._0_8_ + (double)auStack_1a0._8_8_ * local_d8 +
             dStack_108 * local_1a8;
  local_80 = &local_138;
  (pVVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
       local_138 + local_98;
  (pVVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
       dStack_130 + dStack_90;
  (pVVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
       local_128[0] + local_88;
  if (local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_328.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pVVar4;
}

Assistant:

Eigen::Vector3d EGM96Grav::GetGravAccel(Eigen::Vector3d pos, double JD_UTC){

		//make short namespace
		namespace bm = boost::math;

		//initialize output
		Eigen::Vector3d accel;

		//locals
		double r = pos.norm();
		double r2 = pow(r,2.0);
		double r3 = pow(r,3.0);
		double R = this->Rearth_;
		double mu = this->mu_;
		double pUpr = 0.0; //partial potential wrt radius
		double pUpphi = 0.0; //partial potential wrt satellite latitude
		double pUplamb = 0.0; //partial potential wrt satellite latitude
		double nr_ij = sqrt(pow(pos[0],2.0) + pow(pos[1],2.0));

		//matrix rotating from ECEF2ECI
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = ECEF2ECI(JD_UTC, this->nut80ptr_, this->iau1980ptr_, &matvec);

		//ecef position
		Eigen::Vector3d pos_ecef = R_ecef2eci.transpose()*pos;

		// std::cout << "pos_ecef: \n" << pos_ecef << "\n";

		//lat and long
		double phi = asin(pos_ecef[2]/r);
		double lamb = atan2(pos_ecef[1],pos_ecef[0]);

		// std::cout << " JD_UTC: " << JD_UTC << " r: " << r << " phi: " << phi << " lamb: " << lamb << "\n";

		//fixed order gravity model but have capability to do more
		for (double ll = 2; ll < 21; ++ll) {

			for (double mm = 0; mm < ll+1; ++mm) {

		// for (double ll = 2; ll < 3; ++ll) {

		// 	for (double mm = 0; mm < 1; ++mm) {

				//locals
				double powR = pow(R/r,ll);
				double C = this->C_( (int) ll, (int) mm);
				double S = this->S_( (int) ll, (int) mm);
				double Plm = pow(-1.0,mm)*bm::legendre_p( (int) ll, (int) mm, sin(phi)); //pow(-1,m) to account for cordon shortley
				// double Plm_plus = pow(-1.0,mm+1.0)*bm::legendre_p( (int) ll, ((int) mm) + 1, sin(phi));
				double Plm_plus = pow(-1.0,mm)*bm::legendre_p( (int) ll - 1, (int) mm, sin(phi));

				// std::cout << "l: " << ll << " m: " << mm << "\n";

				pUpr += powR*(ll + 1.0)*Plm*(C*cos(mm*lamb) + S*sin(mm*lamb));
				// pUpphi += powR*(Plm_plus - mm*tan(phi)*Plm) * (C*cos(mm*lamb) + S*sin(mm*lamb));
				pUpphi += powR*(-ll*sin(phi)*(1/cos(phi))*Plm + (ll+mm)*(1/cos(phi))*Plm_plus) * (C*cos(mm*lamb) + S*sin(mm*lamb));
				pUplamb += powR*mm*Plm*(S*cos(mm*lamb) - C*sin(mm*lamb));

			}

		}

		//additional factors outside of sum for partials
		// pUpr = pUpr*(-mu/pow(r,2.0));
		// pUpphi = pUpphi*mu/r;
		// pUplamb = pUplamb*mu/r;
		pUpr = pUpr*(-mu/pow(r,2.0));
		pUpphi = pUpphi*mu/pow(r,2.0);
		pUplamb = pUplamb*mu/pow(r,2.0)/cos(phi);

		// pUpphi = -7.0036240305764034*pow(10.0,-8.0);

		// std::cout << "pUpr: " << pUpr << "\n" << "pUpphi: " << pUpphi << "\n" << "pUplamb: " << pUplamb << "\n";

		//calculate components of acceleration
		// accel[0] = (pUpr/r - pos[2]*pUpphi/(r2*nr_ij))*pos[0] - pUplamb*pos[1]/(pow(pos[0],2.0) + pow(pos[1],2.0)) - mu*pos[0]/r3;
		// accel[1] = (pUpr/r - pos[2]*pUpphi/(r2*nr_ij))*pos[1] + pUplamb*pos[0]/(pow(pos[0],2.0) + pow(pos[1],2.0)) - mu*pos[1]/r3;
		// accel[2] = pUpr*pos[2]/r + nr_ij*pUpphi/r2 - mu*pos[2]/r3;
		accel[0] = pUpr;
		accel[1] = pUplamb;
		accel[2] = pUpphi;

		//rotation from spherical to cartesian
		Eigen::Vector3d angles = {phi, -lamb, 0.0};
		std::vector<int> order = {2,3,1};
		Eigen::Matrix3d Rsp2cart = Angle2RotM(angles, order);

		//we also need the central acceleration in ECI
		Eigen::Vector3d accel_central = -(mu/r3)*pos;

		//rotate accel into ECI
		Eigen::Vector3d accel_eci = R_ecef2eci*Rsp2cart*accel + accel_central;

		// std::cout << "\n" << "accel ecef (no central): \n" << Rsp2cart*accel;
		// std::cout << "\n" << "accel eci (with central): \n" << accel_eci;

		// exit(0);

		return accel_eci;

	}